

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O0

int Pdr_ManFreeVar(Pdr_Man_t *p,int k)

{
  int iVar1;
  sat_solver *s;
  Vec_Int_t *p_00;
  Vec_Int_t *vVar2Ids;
  int k_local;
  Pdr_Man_t *p_local;
  
  if (p->pPars->fMonoCnf == 0) {
    p_00 = (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids,k);
    Vec_IntPush(p_00,-1);
    iVar1 = Vec_IntSize(p_00);
    p_local._4_4_ = iVar1 + -1;
  }
  else {
    s = Pdr_ManSolver(p,k);
    p_local._4_4_ = sat_solver_nvars(s);
  }
  return p_local._4_4_;
}

Assistant:

int Pdr_ManFreeVar( Pdr_Man_t * p, int k )
{
    if ( p->pPars->fMonoCnf )
        return sat_solver_nvars( Pdr_ManSolver(p, k) );
    else
    {
        Vec_Int_t * vVar2Ids = (Vec_Int_t *)Vec_PtrEntry( &p->vVar2Ids, k );
        Vec_IntPush( vVar2Ids, -1 );
        return Vec_IntSize( vVar2Ids ) - 1;
    }
}